

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

int8_t getStateProp(int32_t (*stateTable) [256],int8_t *stateProps,int state)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar4;
  
  uVar2 = (ulong)(uint)state;
  stateProps[uVar2] = '\0';
  uVar5 = 0;
  do {
    uVar1 = stateTable[uVar2][uVar5];
    uVar7 = uVar1 >> 0x18 & 0x7f;
    if (stateProps[uVar7] == -1) {
      getStateProp(stateTable,stateProps,uVar7);
    }
    uVar4 = uVar2;
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0xe00000) < 0x600000) goto LAB_002b1806;
    }
    else if (-1 < stateProps[uVar7]) {
LAB_002b1806:
      stateProps[uVar2] = stateProps[uVar2] | (byte)(uVar5 >> 2) & 0xf8;
      uVar6 = 0xff;
      break;
    }
    if (uVar5 == 0xff) goto LAB_002b186a;
    uVar5 = uVar5 + 1;
  } while( true );
LAB_002b181b:
  if (uVar6 <= uVar5) goto LAB_002b1882;
  uVar1 = stateTable[uVar2][uVar6];
  uVar7 = uVar1 >> 0x18 & 0x7f;
  if (stateProps[uVar7] == -1) {
    getStateProp(stateTable,stateProps,uVar7);
  }
  if ((int)uVar1 < 0) {
    if ((uVar1 & 0xe00000) < 0x600000) goto LAB_002b1885;
  }
  else if (-1 < stateProps[uVar7]) goto LAB_002b1885;
  uVar6 = uVar6 - 1;
  goto LAB_002b181b;
LAB_002b186a:
  stateProps[uVar2] = -0x40;
  goto LAB_002b1873;
LAB_002b1882:
  uVar6 = uVar5 & 0xffffffff;
LAB_002b1885:
  stateProps[uVar2] = stateProps[uVar2] | (byte)((uint)uVar6 >> 5);
  for (; uVar5 <= (uVar6 & 0xffffffff); uVar5 = uVar5 + 1) {
    uVar1 = stateTable[uVar2][uVar5];
    uVar7 = uVar1 >> 0x18 & 0x7f;
    if (stateProps[uVar7] == -1) {
      bVar3 = getStateProp(stateTable,stateProps,uVar7);
      uVar4 = (ulong)bVar3;
    }
    if (((int)uVar1 < 0) && (stateProps[uVar7] = stateProps[uVar7] | 0x40, (uVar1 & 0xc00000) == 0))
    {
      stateProps[uVar2] = stateProps[uVar2] | 0x40;
      uVar4 = uVar2;
    }
  }
LAB_002b1873:
  return (int8_t)uVar4;
}

Assistant:

static int8_t
getStateProp(const int32_t (*stateTable)[256], int8_t stateProps[], int state) {
    const int32_t *row;
    int32_t min, max, entry, nextState;

    row=stateTable[state];
    stateProps[state]=0;

    /* find first non-ignorable state */
    for(min=0;; ++min) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
        if(min==0xff) {
            stateProps[state]=-0x40;  /* (int8_t)0xc0 */
            return stateProps[state];
        }
    }
    stateProps[state]|=(int8_t)((min>>5)<<3);

    /* find last non-ignorable state */
    for(max=0xff; min<max; --max) {
        entry=row[max];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
    }
    stateProps[state]|=(int8_t)(max>>5);

    /* recurse further and collect direct-state information */
    while(min<=max) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_FINAL(entry)) {
            stateProps[nextState]|=0x40;
            if(MBCS_ENTRY_FINAL_ACTION(entry)<=MBCS_STATE_FALLBACK_DIRECT_20) {
                stateProps[state]|=0x40;
            }
        }
        ++min;
    }
    return stateProps[state];
}